

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_int,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_int,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  FP32 f;
  float fVar11;
  uint16_t outValue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  ushort local_50;
  allocator_type local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  uint local_3c;
  ulong local_38;
  
  local_48 = __return_storage_ptr__;
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned int, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned int, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned int, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned int, componentCount = 4]"
                 );
  }
  uVar3 = targetBits >> 3;
  local_4c = numChannels;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar3 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_4d);
  uVar4 = (this->super_Image).height;
  if (uVar4 != 0) {
    local_38 = (ulong)uVar3;
    uVar6 = (this->super_Image).width;
    uVar10 = (ulong)local_4c;
    uVar8 = 0;
    uVar5 = local_4c;
    uVar7 = uVar6;
    local_3c = uVar3;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if (uVar5 != 0) {
            puVar1 = (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar9 = 0;
            do {
              uVar7 = (this->super_Image).width * uVar8 + uVar4;
              uVar6 = this->pixels[uVar7].field_0.comps[uVar9];
              if (targetBits == 0x10) {
                fVar11 = (float)uVar6;
                uVar6 = (uint)fVar11 >> 0x17;
                if (uVar6 == 0) {
                  local_50 = 0;
                }
                else if (uVar6 == 0xff) {
                  local_50 = (((uint)fVar11 & 0x7fffff) != 0 | 0x3e) << 9;
                }
                else {
                  local_50 = 0x7c00;
                  if ((uint)fVar11 < 0x47800000) {
                    if ((uint)fVar11 < 0x38800000) {
                      if ((uint)fVar11 < 0x33000000) {
                        local_50 = 0;
                        goto LAB_00178e8d;
                      }
                      uVar2 = (uint)fVar11 & 0x7fffff | 0x800000;
                      local_50 = (ushort)(uVar2 >> (0x7eU - (char)uVar6 & 0x1f));
                      uVar2 = uVar2 >> ((byte)(0x7d - (char)uVar6) & 0x1f);
                    }
                    else {
                      local_50 = ((ushort)((uint)fVar11 >> 0xd) & 0x3ff |
                                 (ushort)((uVar6 & 0x1f) << 10)) ^ 0x4000;
                      uVar2 = (uint)fVar11 >> 0xc;
                    }
                    local_50 = local_50 + ((uVar2 & 1) != 0);
                  }
LAB_00178e8d:
                  local_50 = local_50 & 0x7fff;
                }
                memcpy(puVar1 + (uVar7 * uVar5 + (int)uVar9) * uVar3,&local_50,local_38);
                puVar1 = (local_48->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar5 = local_4c;
                uVar3 = local_3c;
              }
              else if (targetBits == 0x20) {
                *(uint *)(puVar1 + (uVar7 * uVar5 + (int)uVar9) * uVar3) = uVar6;
              }
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
            uVar6 = (this->super_Image).width;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar6);
        uVar4 = (this->super_Image).height;
        uVar7 = uVar6;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar4);
  }
  return local_48;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }